

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void ft::swap<int,ft::allocator<int>>
               (list<int,_ft::allocator<int>_> *x,list<int,_ft::allocator<int>_> *y)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"list swap");
  std::endl<char,std::char_traits<char>>(poVar1);
  list<int,_ft::allocator<int>_>::swap(x,y);
  return;
}

Assistant:

void swap(list<T, Alloc> & x, list<T, Alloc> & y) {
	std::cout << "list swap" << std::endl;
	x.swap(y);
}